

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

int Mf_ManTruthCanonicize(word *t,int nVars)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = *t;
  uVar4 = ~uVar6;
  uVar5 = uVar4;
  if (uVar6 < uVar4) {
    uVar5 = uVar6;
  }
  uVar2 = 1 << ((byte)nVars & 0x1f);
  if (uVar6 <= uVar4) {
    uVar2 = 0;
  }
  if (0 < nVars) {
    pwVar3 = s_Truths6;
    uVar4 = 0;
    uVar6 = uVar5;
    do {
      uVar1 = 1 << ((byte)uVar4 & 0x1f);
      uVar7 = (*pwVar3 & uVar6) >> ((byte)uVar1 & 0x3f) | uVar6 << ((byte)uVar1 & 0x3f) & *pwVar3;
      uVar5 = uVar7;
      if (uVar6 < uVar7) {
        uVar5 = uVar6;
      }
      if (uVar6 <= uVar7) {
        uVar1 = 0;
      }
      uVar2 = uVar2 ^ uVar1;
      uVar4 = uVar4 + 1;
      pwVar3 = pwVar3 + 1;
      uVar6 = uVar5;
    } while ((uint)nVars != uVar4);
  }
  *t = uVar5;
  if (s_vTtMem == (Vec_Mem_t *)0x0) {
    s_vTtMem = Vec_MemAllocForTT(6,0);
  }
  Vec_MemHashInsert(s_vTtMem,t);
  s_nCalls = s_nCalls + 1;
  return uVar2;
}

Assistant:

int Mf_ManTruthCanonicize( word * t, int nVars )
{
    word Temp, Best = *t;
    int r, i, Config = 0;
    for ( r = 0; r < 1; r++ )
    {
        if ( Best > (Temp = ~Best) )
            Best = Temp, Config ^= (1 << nVars);
        for ( i = 0; i < nVars; i++ )
            if ( Best > (Temp = Abc_Tt6Flip(Best, i)) )
                Best = Temp, Config ^= (1 << i);
    }
    *t = Best;
    if ( s_vTtMem == NULL )
        s_vTtMem = Vec_MemAllocForTT( 6, 0 );
    Vec_MemHashInsert( s_vTtMem, t );
    s_nCalls++;
    return Config;
}